

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_reject.cpp
# Opt level: O1

void __thiscall tst_helpers_reject::rejectWithQSharedPtr(tst_helpers_reject *this)

{
  QSharedData *pQVar1;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> QVar2;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<int>_> QVar3;
  Data *dd;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> QVar4;
  bool bVar5;
  char cVar6;
  PromiseData<int> *this_00;
  char *pcVar7;
  char *pcVar8;
  Data *pDVar9;
  bool bVar10;
  QSharedData *pQVar11;
  QPromiseReject<int> *in_R8;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_d8;
  PromiseResolver<int> resolver;
  QPromise<int> p;
  QSharedPointer<int> sptr;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_a0;
  QPromise<int> local_98;
  Type *local_88;
  Data *pDStack_80;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  _Any_data local_50;
  code *local_40;
  
  local_50._0_4_ = 0x2a;
  QSharedPointer<int>::create<int>(&sptr,(int *)local_50._M_pod_data);
  QtPromise::QPromiseBase<int>::
  QPromiseBase<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_include____src_qtpromise_qpromise_inl:173:24),_0>
            (&p.super_QPromiseBase<int>,&sptr);
  p.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0010db90;
  local_88 = (Type *)0x0;
  pDStack_80 = (Data *)0x0;
  this_00 = (PromiseData<int> *)operator_new(0x68);
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
       (_func_int **)0x0;
  *(undefined8 *)&(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData = 0;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data._M_exception_object =
       (void *)0x0;
  (this_00->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size = 0;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size = 0;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = (Data *)0x0;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = (Data *)0x0;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock = 0;
  *(undefined8 *)&(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = 0;
  (this_00->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
       (_func_int **)&PTR__PromiseDataBase_0010dc40;
  QReadWriteLock::QReadWriteLock
            (&(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock,0);
  pQVar11 = &(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = false;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = (Data *)0x0;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size = 0;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = (Data *)0x0;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size = 0;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data._M_exception_object =
       (void *)0x0;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
       (_func_int **)&PTR__PromiseData_0010dbc8;
  (this_00->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this_00->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  LOCK();
  pQVar1 = &(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  LOCK();
  pQVar1 = &(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  local_98.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0010db90;
  local_98.super_QPromiseBase<int>.m_d.d = this_00;
  QtPromisePrivate::PromiseResolver<int>::PromiseResolver(&resolver,&local_98);
  local_98.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0010db60;
  if (local_98.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &((local_98.super_QPromiseBase<int>.m_d.d)->
              super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (local_98.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0)) {
      (*((local_98.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
        _vptr_PromiseDataBase[1])();
    }
  }
  QVar3.d = p.super_QPromiseBase<int>.m_d.d;
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
  }
  local_d8 = resolver.m_d.d;
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
  }
  local_a0 = resolver.m_d.d;
  QtPromisePrivate::PromiseHandler<int,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>
            ((function<void_(const_int_&)> *)&local_50,
             (PromiseHandler<int,decltype(nullptr),void> *)0x0,&local_d8,
             (QPromiseResolve<int> *)&local_a0,in_R8);
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addHandler
            (&(QVar3.d)->super_PromiseDataBase<int,_void_(const_int_&)>,
             (function<void_(const_int_&)> *)&local_50);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  QVar4.d = local_a0.d;
  QVar3.d = p.super_QPromiseBase<int>.m_d.d;
  QVar2.d = local_d8.d;
  if (local_d8.d != (Data *)0x0) {
    LOCK();
    ((local_d8.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_d8.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (local_a0.d != (Data *)0x0) {
    LOCK();
    ((local_a0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_a0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_68 = (code *)0x0;
  pcStack_60 = (code *)0x0;
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_78._M_unused._M_object = operator_new(0x18);
  *(Data **)local_78._M_unused._0_8_ = QVar2.d;
  if (QVar2.d != (Data *)0x0) {
    LOCK();
    ((QVar2.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((QVar2.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
         ._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  *(Data **)((long)local_78._M_unused._0_8_ + 8) = QVar4.d;
  if (QVar4.d == (Data *)0x0) {
    *(Type ***)((long)local_78._M_unused._0_8_ + 0x10) = &local_88;
    pcStack_60 = std::
                 _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
                 ::_M_invoke;
    local_68 = std::
               _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
               ::_M_manager;
  }
  else {
    LOCK();
    ((QVar4.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((QVar4.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
         ._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    *(Type ***)((long)local_78._M_unused._0_8_ + 0x10) = &local_88;
    pcStack_60 = std::
                 _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
                 ::_M_invoke;
    local_68 = std::
               _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
               ::_M_manager;
    LOCK();
    ((QVar4.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((QVar4.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
         ._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((QVar4.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(QVar4.d,0x10);
    }
  }
  if (QVar2.d != (Data *)0x0) {
    LOCK();
    ((QVar2.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((QVar2.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
         ._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((QVar2.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(QVar2.d,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addCatcher
            (&(QVar3.d)->super_PromiseDataBase<int,_void_(const_int_&)>,
             (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_78);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if (local_a0.d != (Data *)0x0) {
    LOCK();
    ((local_a0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)
          ((local_a0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> + -1);
    UNLOCK();
    if (((__int_type)
         ((local_a0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> == 0) &&
       (local_a0.d != (Data *)0x0)) {
      operator_delete(local_a0.d,0x10);
    }
  }
  if (local_d8.d != (Data *)0x0) {
    LOCK();
    ((local_d8.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_d8.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((local_d8.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) &&
       (local_d8.d != (Data *)0x0)) {
      operator_delete(local_d8.d,0x10);
    }
  }
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + -1;
    UNLOCK();
    if ((*(int *)resolver.m_d.d == 0) && (resolver.m_d.d != (Data *)0x0)) {
      operator_delete((void *)resolver.m_d.d,0x10);
    }
  }
  bVar5 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                    (&(p.super_QPromiseBase<int>.m_d.d)->
                      super_PromiseDataBase<int,_void_(const_int_&)>);
  if (!bVar5) {
    QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::dispatch
              (&(p.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>);
  }
  bVar5 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                    ((PromiseDataBase<int,_void_(const_int_&)> *)this_00);
  while (bVar5 != false) {
    QCoreApplication::processEvents();
    QCoreApplication::sendPostedEvents((QObject *)0x0,0x34);
    bVar5 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                      ((PromiseDataBase<int,_void_(const_int_&)> *)this_00);
  }
  LOCK();
  (pQVar11->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar11->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  LOCK();
  (pQVar11->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar11->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar11->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*(this_00->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1])(this_00);
  }
  LOCK();
  (pQVar11->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar11->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar11->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*(this_00->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1])(this_00);
  }
  cVar6 = QTest::compare_helper
                    (local_88 == sptr.value,"Compared values are not the same",(char *)0x0,
                     (char *)0x0,"waitForError(p, QSharedPointer<int>{})","sptr",
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_reject.cpp"
                     ,0x2d);
  QSharedPointer<int>::deref(pDStack_80);
  QSharedPointer<int>::deref((Data *)0x0);
  dd = sptr.d;
  if (cVar6 == '\0') {
    p.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0010db60;
    if (p.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
      LOCK();
      pQVar1 = &((p.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
                super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i == 0) &&
         (p.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0)) {
        (*((p.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
          _vptr_PromiseDataBase[1])();
      }
    }
    QSharedPointer<int>::deref(sptr.d);
    pDVar9 = (Data *)0x0;
  }
  else {
    bVar5 = true;
    if (sptr.d == (Data *)0x0) {
      pDVar9 = (Data *)0x0;
    }
    else {
      LOCK();
      ((sptr.d)->weakref)._q_value.super___atomic_base<int>._M_i =
           ((sptr.d)->weakref)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      pDVar9 = sptr.d;
    }
    bVar10 = sptr.d == (Data *)0x0 || sptr.value == (Type *)0x0;
    sptr.value = (Type *)0x0;
    sptr.d = (Data *)0x0;
    QSharedPointer<int>::deref(dd);
    if (pDVar9 != (Data *)0x0) {
      bVar5 = (pDVar9->strongref)._q_value.super___atomic_base<int>._M_i == 0 || bVar10;
    }
    local_98.super_QPromiseBase<int>._vptr_QPromiseBase =
         (_func_int **)CONCAT71(local_98.super_QPromiseBase<int>._vptr_QPromiseBase._1_7_,bVar5);
    local_88 = (Type *)((ulong)local_88 & 0xffffffffffffff00);
    pcVar7 = QTest::toString<bool>((bool *)&local_98);
    pcVar8 = QTest::toString<bool>((bool *)&local_88);
    cVar6 = QTest::compare_helper
                      (bVar5 == false,"Compared values are not the same",pcVar7,pcVar8,
                       "wptr.isNull()","false",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_reject.cpp"
                       ,0x32);
    p.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0010db60;
    if (p.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
      LOCK();
      pQVar1 = &((p.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
                super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i == 0) &&
         (p.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0)) {
        (*((p.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
          _vptr_PromiseDataBase[1])();
      }
    }
    QSharedPointer<int>::deref(sptr.d);
    if (cVar6 != '\0') {
      if (pDVar9 == (Data *)0x0) {
        bVar10 = true;
      }
      else {
        bVar10 = (pDVar9->strongref)._q_value.super___atomic_base<int>._M_i == 0 || bVar10;
      }
      local_98.super_QPromiseBase<int>._vptr_QPromiseBase =
           (_func_int **)CONCAT71(local_98.super_QPromiseBase<int>._vptr_QPromiseBase._1_7_,bVar10);
      sptr.value = (Type *)CONCAT71(sptr.value._1_7_,1);
      pcVar7 = QTest::toString<bool>((bool *)&local_98);
      pcVar8 = QTest::toString<bool>((bool *)&sptr);
      QTest::compare_helper
                (bVar10,"Compared values are not the same",pcVar7,pcVar8,"wptr.isNull()","true",
                 "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_reject.cpp"
                 ,0x35);
    }
  }
  if (pDVar9 != (Data *)0x0) {
    LOCK();
    (pDVar9->weakref)._q_value.super___atomic_base<int>._M_i =
         (pDVar9->weakref)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar9->weakref)._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(pDVar9);
    }
  }
  return;
}

Assistant:

void tst_helpers_reject::rejectWithQSharedPtr()
{
    QWeakPointer<int> wptr;

    {
        auto sptr = QSharedPointer<int>::create(42);
        auto p = QtPromise::QPromise<int>::reject(sptr);

        QCOMPARE(waitForError(p, QSharedPointer<int>{}), sptr);

        wptr = sptr;
        sptr.reset();

        QCOMPARE(wptr.isNull(), false); // "p" still holds a reference
    }

    QCOMPARE(wptr.isNull(), true);
}